

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

void quicly_request_stop(quicly_stream_t *stream,int err)

{
  int iVar1;
  uint in_ESI;
  undefined8 *in_RDI;
  quicly_stream_id_t in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffff0;
  
  quicly_is_client((quicly_conn_t *)*in_RDI);
  iVar1 = quicly_stream_has_receive_side(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  if (iVar1 == 0) {
    __assert_fail("quicly_stream_has_receive_side(quicly_is_client(stream->conn), stream->stream_id)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x174b,"void quicly_request_stop(quicly_stream_t *, int)");
  }
  if ((in_ESI & 0xffff0000) == 0x30000) {
    if ((in_RDI[0x15] == -1) && (*(int *)(in_RDI + 0x19) == 0)) {
      *(undefined4 *)(in_RDI + 0x19) = 1;
      *(short *)((long)in_RDI + 0xcc) = (short)in_ESI;
      sched_stream_control((quicly_stream_t *)0x13e93a);
    }
    return;
  }
  __assert_fail("QUICLY_ERROR_IS_QUIC_APPLICATION(err)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                ,0x174c,"void quicly_request_stop(quicly_stream_t *, int)");
}

Assistant:

void quicly_request_stop(quicly_stream_t *stream, int err)
{
    assert(quicly_stream_has_receive_side(quicly_is_client(stream->conn), stream->stream_id));
    assert(QUICLY_ERROR_IS_QUIC_APPLICATION(err));

    /* send STOP_SENDING if the incoming side of the stream is still open */
    if (stream->recvstate.eos == UINT64_MAX && stream->_send_aux.stop_sending.sender_state == QUICLY_SENDER_STATE_NONE) {
        stream->_send_aux.stop_sending.sender_state = QUICLY_SENDER_STATE_SEND;
        stream->_send_aux.stop_sending.error_code = QUICLY_ERROR_GET_ERROR_CODE(err);
        sched_stream_control(stream);
    }
}